

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_test.cpp
# Opt level: O0

void __thiscall
SpinMutexTest_TryLock_Test<yamc::spin_weak::basic_mutex<yamc::backoff::exponential<4000U>_>_>::
~SpinMutexTest_TryLock_Test
          (SpinMutexTest_TryLock_Test<yamc::spin_weak::basic_mutex<yamc::backoff::exponential<4000U>_>_>
           *this)

{
  SpinMutexTest_TryLock_Test<yamc::spin_weak::basic_mutex<yamc::backoff::exponential<4000U>_>_>
  *this_local;
  
  ~SpinMutexTest_TryLock_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(SpinMutexTest, TryLock)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock()) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}